

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::Reg2Aux
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,uint byteOffset,int C1)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  undefined6 in_register_00000032;
  FunctionBody *pFVar5;
  uint local_48;
  RegSlot local_44;
  OpLayoutReg2Aux data;
  
  data.R1 = (RegSlot)CONCAT62(in_register_00000032,op);
  data.super_OpLayoutAuxiliary.R0 = C1;
  CheckOpen(this);
  if (R0 != 0xffffffff) {
    pFVar5 = this->m_functionWrite;
    if (pFVar5 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_00895a2c;
      *puVar4 = 0;
      pFVar5 = this->m_functionWrite;
    }
    RVar3 = FunctionBody::MapRegSlot(pFVar5,R0);
    if (R1 != 0xffffffff) {
      pFVar5 = this->m_functionWrite;
      if (pFVar5 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar2) goto LAB_00895a2c;
        *puVar4 = 0;
        pFVar5 = this->m_functionWrite;
      }
      data.super_OpLayoutAuxiliary.super_OpLayoutAuxNoReg.C1 = FunctionBody::MapRegSlot(pFVar5,R1);
      if (byteOffset < (this->m_auxiliaryData).currentOffset) {
LAB_0089598f:
        local_44 = data.super_OpLayoutAuxiliary.R0;
        local_48 = byteOffset;
        data.super_OpLayoutAuxiliary.super_OpLayoutAuxNoReg.Offset = RVar3;
        Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,(OpCode)data.R1,this);
        Data::Write(&this->m_byteCodeData,&local_48,0x10);
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0xa30,"(byteOffset < m_auxiliaryData.GetCurrentOffset())",
                                  "byteOffset < m_auxiliaryData.GetCurrentOffset()");
      if (bVar2) {
        *puVar4 = 0;
        goto LAB_0089598f;
      }
      goto LAB_00895a2c;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar4 = 0;
    Throw::InternalError();
  }
LAB_00895a2c:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Reg2Aux(OpCode op, RegSlot R0, RegSlot R1, uint byteOffset, int C1)
    {
        CheckOpen();
        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);

        //
        // Write the buffer's contents
        //

        Assert(byteOffset < m_auxiliaryData.GetCurrentOffset());

        OpLayoutReg2Aux data;
        data.R0 = R0;
        data.R1 = R1;
        data.Offset = byteOffset;
        data.C1 = C1;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
    }